

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::writeSequentialContainer<QList<QKeyCombination>>
          (QDataStream *s,QList<QKeyCombination> *c)

{
  bool bVar1;
  const_iterator o;
  QList<QKeyCombination> *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  value_type *t;
  QList<QKeyCombination> *__range2;
  const_iterator __end0;
  const_iterator __begin0;
  QDataStream *in_stack_ffffffffffffff98;
  QDataStream *in_stack_ffffffffffffffa0;
  QDataStream *pQVar2;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  QList<QKeyCombination>::size(in_RSI);
  bVar1 = QDataStream::writeQSizeType(in_stack_ffffffffffffff98,0x5aa7c1);
  if (bVar1) {
    local_10.i = (QKeyCombination *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QKeyCombination>::begin((QList<QKeyCombination> *)in_stack_ffffffffffffffa0);
    o = QList<QKeyCombination>::end((QList<QKeyCombination> *)in_stack_ffffffffffffffa0);
    while (bVar1 = QList<QKeyCombination>::const_iterator::operator!=(&local_10,o), bVar1) {
      QList<QKeyCombination>::const_iterator::operator*(&local_10);
      ::operator<<(in_stack_ffffffffffffffa0,(QKeyCombination)(int)((ulong)pQVar2 >> 0x20));
      QList<QKeyCombination>::const_iterator::operator++(&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}